

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeBufferApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::read_pixels_format_mismatch
               (NegativeTestContext *ctx)

{
  GLenum type;
  GLenum format;
  pointer puVar1;
  reference pvVar2;
  reference pvVar3;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  GLenum local_64;
  GLenum local_60;
  GLint readType;
  GLint readFormat;
  vector<unsigned_short,_std::allocator<unsigned_short>_> ushortData;
  allocator<unsigned_char> local_29;
  undefined1 local_28 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> ubyteData;
  NegativeTestContext *ctx_local;
  
  ubyteData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)ctx;
  std::allocator<unsigned_char>::allocator(&local_29);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,4,&local_29);
  std::allocator<unsigned_char>::~allocator(&local_29);
  std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)((long)&readType + 3));
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&readFormat,4,
             (allocator<unsigned_short> *)((long)&readType + 3));
  std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)((long)&readType + 3));
  puVar1 = ubyteData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  local_60 = 0x1234;
  local_64 = 0x1234;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,
             "Unsupported combinations of format and type will generate an GL_INVALID_OPERATION error."
             ,&local_89);
  NegativeTestContext::beginSection((NegativeTestContext *)puVar1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  puVar1 = ubyteData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pvVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&readFormat,0);
  glu::CallLogWrapper::glReadPixels((CallLogWrapper *)puVar1,0,0,1,1,0x1908,0x8363,pvVar2);
  NegativeTestContext::expectError
            ((NegativeTestContext *)
             ubyteData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0x502);
  puVar1 = ubyteData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pvVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&readFormat,0);
  glu::CallLogWrapper::glReadPixels((CallLogWrapper *)puVar1,0,0,1,1,0x1906,0x8363,pvVar2);
  NegativeTestContext::expectError
            ((NegativeTestContext *)
             ubyteData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0x502);
  puVar1 = ubyteData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pvVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&readFormat,0);
  glu::CallLogWrapper::glReadPixels((CallLogWrapper *)puVar1,0,0,1,1,0x1907,0x8033,pvVar2);
  NegativeTestContext::expectError
            ((NegativeTestContext *)
             ubyteData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0x502);
  puVar1 = ubyteData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pvVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&readFormat,0);
  glu::CallLogWrapper::glReadPixels((CallLogWrapper *)puVar1,0,0,1,1,0x1906,0x8033,pvVar2);
  NegativeTestContext::expectError
            ((NegativeTestContext *)
             ubyteData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0x502);
  puVar1 = ubyteData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pvVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&readFormat,0);
  glu::CallLogWrapper::glReadPixels((CallLogWrapper *)puVar1,0,0,1,1,0x1907,0x8034,pvVar2);
  NegativeTestContext::expectError
            ((NegativeTestContext *)
             ubyteData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0x502);
  puVar1 = ubyteData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pvVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&readFormat,0);
  glu::CallLogWrapper::glReadPixels((CallLogWrapper *)puVar1,0,0,1,1,0x1906,0x8034,pvVar2);
  NegativeTestContext::expectError
            ((NegativeTestContext *)
             ubyteData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0x502);
  NegativeTestContext::endSection
            ((NegativeTestContext *)
             ubyteData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  puVar1 = ubyteData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,
             "GL_RGBA/GL_UNSIGNED_BYTE is always accepted and the other acceptable pair can be discovered by querying GL_IMPLEMENTATION_COLOR_READ_FORMAT and GL_IMPLEMENTATION_COLOR_READ_TYPE."
             ,&local_b1);
  NegativeTestContext::beginSection((NegativeTestContext *)puVar1,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  puVar1 = ubyteData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,0);
  glu::CallLogWrapper::glReadPixels((CallLogWrapper *)puVar1,0,0,1,1,0x1908,0x1401,pvVar3);
  NegativeTestContext::expectError
            ((NegativeTestContext *)
             ubyteData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0);
  glu::CallLogWrapper::glGetIntegerv
            ((CallLogWrapper *)
             ubyteData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0x8b9b,(GLint *)&local_60);
  glu::CallLogWrapper::glGetIntegerv
            ((CallLogWrapper *)
             ubyteData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0x8b9a,(GLint *)&local_64);
  puVar1 = ubyteData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  format = local_60;
  type = local_64;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,0);
  glu::CallLogWrapper::glReadPixels((CallLogWrapper *)puVar1,0,0,1,1,format,type,pvVar3);
  NegativeTestContext::expectError
            ((NegativeTestContext *)
             ubyteData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,0);
  NegativeTestContext::endSection
            ((NegativeTestContext *)
             ubyteData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&readFormat);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  return;
}

Assistant:

void read_pixels_format_mismatch (NegativeTestContext& ctx)
{
	std::vector<GLubyte>	ubyteData	(4);
	std::vector<GLushort>	ushortData	(4);
	GLint					readFormat	= 0x1234;
	GLint					readType	= 0x1234;

	ctx.beginSection("Unsupported combinations of format and type will generate an GL_INVALID_OPERATION error.");
	ctx.glReadPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_SHORT_5_6_5, &ushortData[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glReadPixels(0, 0, 1, 1, GL_ALPHA, GL_UNSIGNED_SHORT_5_6_5, &ushortData[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glReadPixels(0, 0, 1, 1, GL_RGB, GL_UNSIGNED_SHORT_4_4_4_4, &ushortData[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glReadPixels(0, 0, 1, 1, GL_ALPHA, GL_UNSIGNED_SHORT_4_4_4_4, &ushortData[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glReadPixels(0, 0, 1, 1, GL_RGB, GL_UNSIGNED_SHORT_5_5_5_1, &ushortData[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glReadPixels(0, 0, 1, 1, GL_ALPHA, GL_UNSIGNED_SHORT_5_5_5_1, &ushortData[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_RGBA/GL_UNSIGNED_BYTE is always accepted and the other acceptable pair can be discovered by querying GL_IMPLEMENTATION_COLOR_READ_FORMAT and GL_IMPLEMENTATION_COLOR_READ_TYPE.");
	ctx.glReadPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, &ubyteData[0]);
	ctx.expectError(GL_NO_ERROR);
	ctx.glGetIntegerv(GL_IMPLEMENTATION_COLOR_READ_FORMAT, &readFormat);
	ctx.glGetIntegerv(GL_IMPLEMENTATION_COLOR_READ_TYPE, &readType);
	ctx.glReadPixels(0, 0, 1, 1, readFormat, readType, &ubyteData[0]);
	ctx.expectError(GL_NO_ERROR);
	ctx.endSection();
}